

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

UniValue *
generateBlocks(ChainstateManager *chainman,Mining *miner,CScript *coinbase_script,int nGenerate,
              uint64_t nMaxTries)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  pointer pBVar4;
  unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_> *in_RCX;
  CBlockHeader *in_RDX;
  UniValue *in_RSI;
  CBlock *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  UniValue *blockHashes;
  shared_ptr<const_CBlock> block_out;
  unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>
  block_template;
  CBlock *in_stack_fffffffffffffe18;
  undefined6 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  UniValue *this;
  UniValue *in_stack_fffffffffffffe38;
  CBlockHeader *this_00;
  byte local_1b9;
  CBlock *val;
  UniValue *this_01;
  undefined4 in_stack_fffffffffffffe60;
  int iVar5;
  undefined4 in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe6c;
  uint3 in_stack_fffffffffffffe70;
  uint uVar6;
  CBlock *block;
  Mining *in_stack_fffffffffffffe98;
  ChainstateManager *in_stack_fffffffffffffea0;
  undefined1 local_158 [8];
  undefined8 local_150;
  undefined8 local_148;
  undefined1 local_140 [168];
  undefined1 local_98 [112];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (uint)in_stack_fffffffffffffe70;
  this_01 = (UniValue *)&stack0xffffffffffffffd8;
  val = in_RDI;
  block = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffe30);
  UniValue::UniValue(in_stack_fffffffffffffe38,(VType)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffe2f,
                              CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe18);
  while( true ) {
    local_1b9 = 0;
    this_00 = in_RDX;
    this = in_RSI;
    if (0 < in_R8D) {
      bVar1 = util::SignalInterrupt::operator_cast_to_bool
                        ((SignalInterrupt *)in_stack_fffffffffffffe18);
      local_1b9 = bVar1 ^ 0xff;
      this_00 = in_RDX;
      this = in_RSI;
    }
    if ((local_1b9 & 1) == 0) break;
    local_158[0] = 1;
    local_150 = 4000;
    local_148 = 400;
    (**(code **)(*(long *)this_00 + 0x30))(local_140,this_00,in_RCX,local_158);
    inline_check_non_fatal<std::unique_ptr<interfaces::BlockTemplate,std::default_delete<interfaces::BlockTemplate>>&>
              (in_RCX,(char *)CONCAT44(in_R8D,uVar6),in_stack_fffffffffffffe6c,
               (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),(char *)this_01
              );
    std::shared_ptr<const_CBlock>::shared_ptr((shared_ptr<const_CBlock> *)in_stack_fffffffffffffe18)
    ;
    in_RDX = this_00;
    in_RSI = this;
    pBVar4 = std::
             unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>
             ::operator->((unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>
                           *)in_stack_fffffffffffffe18);
    (*pBVar4->_vptr_BlockTemplate[3])(local_98);
    uVar2 = GenerateBlock(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,block,
                          (uint64_t *)in_RSI,(shared_ptr<const_CBlock> *)in_RDX,
                          SUB81((ulong)in_RCX >> 0x38,0));
    bVar3 = uVar2 ^ 0xff;
    CBlock::~CBlock(in_stack_fffffffffffffe18);
    if ((bVar3 & 1) == 0) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)
                         in_stack_fffffffffffffe18);
      if (bVar1) {
        in_R8D = in_R8D + -1;
        std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   in_stack_fffffffffffffe18);
        CBlockHeader::GetHash(this_00);
        base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)this);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val)
        ;
        UniValue::push_back(this,(UniValue *)
                                 CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe28)));
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffe18);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe18);
      }
      iVar5 = 0;
    }
    else {
      iVar5 = 3;
    }
    std::shared_ptr<const_CBlock>::~shared_ptr
              ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffe18);
    std::unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>::
    ~unique_ptr((unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>
                 *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe28)));
    if (iVar5 != 0) break;
    in_stack_fffffffffffffe60 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (UniValue *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue generateBlocks(ChainstateManager& chainman, Mining& miner, const CScript& coinbase_script, int nGenerate, uint64_t nMaxTries)
{
    UniValue blockHashes(UniValue::VARR);
    while (nGenerate > 0 && !chainman.m_interrupt) {
        std::unique_ptr<BlockTemplate> block_template(miner.createNewBlock(coinbase_script));
        CHECK_NONFATAL(block_template);

        std::shared_ptr<const CBlock> block_out;
        if (!GenerateBlock(chainman, miner, block_template->getBlock(), nMaxTries, block_out, /*process_new_block=*/true)) {
            break;
        }

        if (block_out) {
            --nGenerate;
            blockHashes.push_back(block_out->GetHash().GetHex());
        }
    }
    return blockHashes;
}